

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handshake.cc
# Opt level: O0

bool __thiscall
bssl::SSL_HANDSHAKE::GetClientHello
          (SSL_HANDSHAKE *this,SSLMessage *out_msg,SSL_CLIENT_HELLO *out_client_hello)

{
  SSL *ssl;
  SSL_CLIENT_HELLO *out;
  bool bVar1;
  int iVar2;
  int iVar3;
  uint8_t *in;
  size_t len;
  Span<unsigned_char> local_90;
  Span<unsigned_char> local_80;
  Span<const_unsigned_char> local_70;
  cbs_st local_60;
  size_t local_50;
  size_t header_len;
  cbs_st local_38;
  SSL_CLIENT_HELLO *local_28;
  SSL_CLIENT_HELLO *out_client_hello_local;
  SSLMessage *out_msg_local;
  SSL_HANDSHAKE *this_local;
  
  local_28 = out_client_hello;
  out_client_hello_local = (SSL_CLIENT_HELLO *)out_msg;
  out_msg_local = (SSLMessage *)this;
  bVar1 = Array<unsigned_char>::empty(&this->ech_client_hello_buf);
  if (bVar1) {
    bVar1 = (*this->ssl->method->get_message)(this->ssl,(SSLMessage *)out_client_hello_local);
    if (!bVar1) {
      ERR_put_error(0x10,0,0x44,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/handshake.cc"
                    ,0x57);
      return false;
    }
  }
  else {
    *(undefined1 *)&out_client_hello_local->ssl = 0;
    *(undefined1 *)((long)&out_client_hello_local->ssl + 1) = 1;
    Span<unsigned_char_const>::Span<bssl::Array<unsigned_char>,void,bssl::Array<unsigned_char>>
              ((Span<unsigned_char_const> *)&header_len,&this->ech_client_hello_buf);
    cbs_st::cbs_st(&local_38,_header_len);
    *(uint8_t **)&out_client_hello_local->version = local_38.data;
    out_client_hello_local->random = (uint8_t *)local_38.len;
    iVar2 = SSL_is_dtls(this->ssl);
    iVar3 = 4;
    if (iVar2 != 0) {
      iVar3 = 0xc;
    }
    local_50 = (size_t)iVar3;
    Span<unsigned_char>::Span<bssl::Array<unsigned_char>,void,bssl::Array<unsigned_char>>
              (&local_90,&this->ech_client_hello_buf);
    local_80 = Span<unsigned_char>::subspan(&local_90,local_50,0xffffffffffffffff);
    Span<unsigned_char_const>::Span<bssl::Span<unsigned_char>,void,bssl::Span<unsigned_char>>
              ((Span<unsigned_char_const> *)&local_70,&local_80);
    cbs_st::cbs_st(&local_60,local_70);
    out_client_hello_local->client_hello = local_60.data;
    out_client_hello_local->client_hello_len = local_60.len;
  }
  out = local_28;
  ssl = this->ssl;
  in = CBS_data((CBS *)&out_client_hello_local->client_hello);
  len = CBS_len((CBS *)&out_client_hello_local->client_hello);
  iVar2 = SSL_parse_client_hello(ssl,out,in,len);
  if (iVar2 == 0) {
    ssl_send_alert(this->ssl,2,0x32);
  }
  return iVar2 != 0;
}

Assistant:

bool SSL_HANDSHAKE::GetClientHello(SSLMessage *out_msg,
                                   SSL_CLIENT_HELLO *out_client_hello) {
  if (!ech_client_hello_buf.empty()) {
    // If the backing buffer is non-empty, the ClientHelloInner has been set.
    out_msg->is_v2_hello = false;
    out_msg->type = SSL3_MT_CLIENT_HELLO;
    out_msg->raw = CBS(ech_client_hello_buf);
    size_t header_len =
        SSL_is_dtls(ssl) ? DTLS1_HM_HEADER_LENGTH : SSL3_HM_HEADER_LENGTH;
    out_msg->body = CBS(Span(ech_client_hello_buf).subspan(header_len));
  } else if (!ssl->method->get_message(ssl, out_msg)) {
    // The message has already been read, so this cannot fail.
    OPENSSL_PUT_ERROR(SSL, ERR_R_INTERNAL_ERROR);
    return false;
  }

  if (!SSL_parse_client_hello(ssl, out_client_hello, CBS_data(&out_msg->body),
                              CBS_len(&out_msg->body))) {
    ssl_send_alert(ssl, SSL3_AL_FATAL, SSL_AD_DECODE_ERROR);
    return false;
  }
  return true;
}